

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parg.hh
# Opt level: O2

int __thiscall OB::Parg::pipe_stdin(Parg *this)

{
  int iVar1;
  int iVar2;
  istreambuf_iterator<char,_std::char_traits<char>_> __first;
  
  iVar2 = 0;
  iVar1 = isatty(0);
  if (iVar1 == 0) {
    __first._8_8_ = 0xffffffffffffffff;
    __first._M_sbuf = *(streambuf_type **)(*(long *)(std::cin + -0x18) + 0x12f468);
    std::__cxx11::string::assign<std::istreambuf_iterator<char,std::char_traits<char>>,void>
              ((string *)&this->stdin_,__first,
               (istreambuf_iterator<char,_std::char_traits<char>_>)(ZEXT816(0xffffffff) << 0x40));
  }
  else {
    std::__cxx11::string::assign((char *)&this->stdin_);
    iVar2 = -1;
  }
  return iVar2;
}

Assistant:

int pipe_stdin()
  {
    if (! isatty(STDIN_FILENO))
    {
      stdin_.assign((std::istreambuf_iterator<char>(std::cin)),
        (std::istreambuf_iterator<char>()));
      return 0;
    }
    stdin_ = "";
    return -1;
  }